

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandLutExact(Abc_Frame_t *pAbc,int argc,char **argv)

{
  char cVar1;
  uint uVar2;
  size_t sVar3;
  char *pcVar4;
  Bmc_EsPar_t *pPars;
  Bmc_EsPar_t Pars;
  int c;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  Bmc_EsParSetDefault((Bmc_EsPar_t *)&pPars);
  Extra_UtilGetoptReset();
LAB_002705ce:
  do {
    Pars.pTtStr._4_4_ = Extra_UtilGetopt(argc,argv,"INKTiaogvh");
    if (Pars.pTtStr._4_4_ == -1) {
      if (argc == globalUtilOptind + 1) {
        Pars._48_8_ = argv[globalUtilOptind];
      }
      if (Pars._48_8_ == 0) {
        Abc_Print(-1,"Truth table should be given on the command line.\n");
        return 1;
      }
      cVar1 = (char)(uint)pPars;
      sVar3 = strlen((char *)Pars._48_8_);
      if (1 << (cVar1 - 2U & 0x1f) != (int)sVar3) {
        cVar1 = (char)(uint)pPars;
        sVar3 = strlen((char *)Pars._48_8_);
        Abc_Print(-1,"Truth table is expected to have %d hex digits (instead of %d).\n",
                  (ulong)(uint)(1 << (cVar1 - 2U & 0x1f)),sVar3);
        return 1;
      }
      if ((int)(pPars._4_4_ * (Pars.nVars + -1) + 1) < (int)(uint)pPars) {
        Abc_Print(-1,"Function with %d variales cannot be implemented with %d %d-input LUTs.\n",
                  (ulong)(uint)pPars,(ulong)pPars._4_4_,(ulong)(uint)Pars.nVars);
        return 1;
      }
      if (10 < (int)(uint)pPars) {
        Abc_Print(-1,"Function should not have more than 10 inputs.\n");
        return 1;
      }
      if (6 < Pars.nVars) {
        Abc_Print(-1,"Node size should not be more than 6 inputs.\n");
        return 1;
      }
      if (Pars.fUseIncr == 0) {
        Exa3_ManExactSynthesis2((Bmc_EsPar_t *)&pPars);
      }
      else {
        Exa3_ManExactSynthesis((Bmc_EsPar_t *)&pPars);
      }
      return 0;
    }
    switch(Pars.pTtStr._4_4_) {
    case 0x49:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-I\" should be followed by an integer.\n");
        goto LAB_002709bd;
      }
      pPars._0_4_ = atoi(argv[globalUtilOptind]);
      uVar2 = (uint)pPars;
      break;
    default:
      goto LAB_002709bd;
    case 0x4b:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-K\" should be followed by an integer.\n");
        goto LAB_002709bd;
      }
      Pars.nVars = atoi(argv[globalUtilOptind]);
      uVar2 = Pars.nVars;
      break;
    case 0x4e:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-N\" should be followed by an integer.\n");
        goto LAB_002709bd;
      }
      pPars._4_4_ = atoi(argv[globalUtilOptind]);
      uVar2 = pPars._4_4_;
      break;
    case 0x54:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-T\" should be followed by an integer.\n");
        goto LAB_002709bd;
      }
      Pars.fEnumSols = atoi(argv[globalUtilOptind]);
      uVar2 = Pars.fEnumSols;
      break;
    case 0x61:
      Pars.fMajority = Pars.fMajority ^ 1;
      goto LAB_002705ce;
    case 0x67:
      Pars.fUseIncr = Pars.fUseIncr ^ 1;
      goto LAB_002705ce;
    case 0x68:
      goto LAB_002709bd;
    case 0x69:
      Pars.nMajSupp = Pars.nMajSupp ^ 1;
      goto LAB_002705ce;
    case 0x6f:
      Pars.fOrderNodes = Pars.fOrderNodes ^ 1;
      goto LAB_002705ce;
    case 0x76:
      Pars.fFewerVars = Pars.fFewerVars ^ 1;
      goto LAB_002705ce;
    }
    globalUtilOptind = globalUtilOptind + 1;
    if ((int)uVar2 < 0) {
LAB_002709bd:
      Abc_Print(-2,"usage: lutexact [-INKT <num>] [-iaogvh] <hex>\n");
      Abc_Print(-2,"\t           exact synthesis of I-input function using N K-input gates\n");
      Abc_Print(-2,"\t-I <num> : the number of input variables [default = %d]\n",(ulong)(uint)pPars)
      ;
      Abc_Print(-2,"\t-N <num> : the number of K-input nodes [default = %d]\n",(ulong)pPars._4_4_);
      Abc_Print(-2,"\t-K <num> : the number of node fanins [default = %d]\n",(ulong)(uint)Pars.nVars
               );
      Abc_Print(-2,"\t-T <num> : the runtime limit in seconds [default = %d]\n",
                (ulong)(uint)Pars.fEnumSols);
      pcVar4 = "no";
      if (Pars.nMajSupp != 0) {
        pcVar4 = "yes";
      }
      Abc_Print(-2,"\t-i       : toggle using incremental solving [default = %s]\n",pcVar4);
      pcVar4 = "no";
      if (Pars.fMajority != 0) {
        pcVar4 = "yes";
      }
      Abc_Print(-2,"\t-a       : toggle using only AND-gates when K = 2 [default = %s]\n",pcVar4);
      pcVar4 = "no";
      if (Pars.fOrderNodes != 0) {
        pcVar4 = "yes";
      }
      Abc_Print(-2,"\t-o       : toggle using additional optimizations [default = %s]\n",pcVar4);
      pcVar4 = "no";
      if (Pars.fUseIncr != 0) {
        pcVar4 = "yes";
      }
      Abc_Print(-2,
                "\t-g       : toggle using Glucose 3.0 by Gilles Audemard and Laurent Simon [default = %s]\n"
                ,pcVar4);
      pcVar4 = "no";
      if (Pars.fFewerVars != 0) {
        pcVar4 = "yes";
      }
      Abc_Print(-2,"\t-v       : toggle verbose printout [default = %s]\n",pcVar4);
      Abc_Print(-2,"\t-h       : print the command usage\n");
      Abc_Print(-2,"\t<hex>    : truth table in hex notation\n");
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandLutExact( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern void Exa3_ManExactSynthesis( Bmc_EsPar_t * pPars );
    extern void Exa3_ManExactSynthesis2( Bmc_EsPar_t * pPars );
    int c;
    Bmc_EsPar_t Pars, * pPars = &Pars;
    Bmc_EsParSetDefault( pPars );
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "INKTiaogvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'I':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-I\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nVars = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nVars < 0 )
                goto usage;
            break;
        case 'N':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-N\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nNodes = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nNodes < 0 )
                goto usage;
            break;
       case 'K':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-K\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nLutSize = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nLutSize < 0 )
                goto usage;
            break;
        case 'T':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-T\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->RuntimeLim = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->RuntimeLim < 0 )
                goto usage;
            break;
        case 'i':
            pPars->fUseIncr ^= 1;
            break;
        case 'a':
            pPars->fOnlyAnd ^= 1;
            break;
        case 'o':
            pPars->fFewerVars ^= 1;
            break;
        case 'g':
            pPars->fGlucose ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( argc == globalUtilOptind + 1 )
        pPars->pTtStr = argv[globalUtilOptind];
    if ( pPars->pTtStr == NULL )
    {
        Abc_Print( -1, "Truth table should be given on the command line.\n" );
        return 1;
    }
    if ( (1 << (pPars->nVars-2)) != (int)strlen(pPars->pTtStr) )
    {
        Abc_Print( -1, "Truth table is expected to have %d hex digits (instead of %d).\n", (1 << (pPars->nVars-2)), strlen(pPars->pTtStr) );
        return 1;
    }
    if ( pPars->nVars > pPars->nNodes * (pPars->nLutSize - 1) + 1 )
    {
        Abc_Print( -1, "Function with %d variales cannot be implemented with %d %d-input LUTs.\n", pPars->nVars, pPars->nNodes, pPars->nLutSize );
        return 1;
    }
    if ( pPars->nVars > 10 )
    {
        Abc_Print( -1, "Function should not have more than 10 inputs.\n" );
        return 1;
    }
    if ( pPars->nLutSize > 6 )
    {
        Abc_Print( -1, "Node size should not be more than 6 inputs.\n" );
        return 1;
    }
    if ( pPars->fGlucose )
        Exa3_ManExactSynthesis( pPars );
    else
        Exa3_ManExactSynthesis2( pPars );
    return 0;

usage:
    Abc_Print( -2, "usage: lutexact [-INKT <num>] [-iaogvh] <hex>\n" );
    Abc_Print( -2, "\t           exact synthesis of I-input function using N K-input gates\n" );
    Abc_Print( -2, "\t-I <num> : the number of input variables [default = %d]\n", pPars->nVars );
    Abc_Print( -2, "\t-N <num> : the number of K-input nodes [default = %d]\n", pPars->nNodes );
    Abc_Print( -2, "\t-K <num> : the number of node fanins [default = %d]\n", pPars->nLutSize );
    Abc_Print( -2, "\t-T <num> : the runtime limit in seconds [default = %d]\n", pPars->RuntimeLim );
    Abc_Print( -2, "\t-i       : toggle using incremental solving [default = %s]\n", pPars->fUseIncr ? "yes" : "no" );
    Abc_Print( -2, "\t-a       : toggle using only AND-gates when K = 2 [default = %s]\n", pPars->fOnlyAnd ? "yes" : "no" );
    Abc_Print( -2, "\t-o       : toggle using additional optimizations [default = %s]\n", pPars->fFewerVars ? "yes" : "no" );
    Abc_Print( -2, "\t-g       : toggle using Glucose 3.0 by Gilles Audemard and Laurent Simon [default = %s]\n", pPars->fGlucose ? "yes" : "no" );
    Abc_Print( -2, "\t-v       : toggle verbose printout [default = %s]\n", pPars->fVerbose ? "yes" : "no" );
    Abc_Print( -2, "\t-h       : print the command usage\n" );
    Abc_Print( -2, "\t<hex>    : truth table in hex notation\n" );
    return 1;
}